

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCEXP.hpp
# Opt level: O2

int __thiscall CCEXP::CCEXPMat<unsigned_char>::StoreData(CCEXPMat<unsigned_char> *this,FILE *fp)

{
  ulong uVar1;
  pointer pMVar2;
  uint64_t __size;
  int iVar3;
  ulong uVar4;
  pointer pMVar5;
  ulong new_elements_;
  long lVar6;
  uint64_t _maxRows64;
  uint64_t typeSize;
  ulong local_b8;
  MVECTOR<unsigned_char> n;
  MVECTOR<unsigned_long> DPL;
  
  iVar3 = 0;
  if (this->IgnoreM == false) {
    if (fp == (FILE *)0x0) {
      iVar3 = -9999;
      CECS::RecError((CECS *)CCEXPECS,-9999,1,"CCEXP.hpp",0x1a0,
                     "CCEXPMat::StoreData():: File pointer is NULL! (!%u!)");
    }
    else {
      local_b8 = (long)(this->data).
                       super__Vector_base<ns_MVECTOR::MVECTOR<unsigned_char>,_std::allocator<ns_MVECTOR::MVECTOR<unsigned_char>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->data).
                       super__Vector_base<ns_MVECTOR::MVECTOR<unsigned_char>,_std::allocator<ns_MVECTOR::MVECTOR<unsigned_char>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 6;
      typeSize = 1;
      _maxRows64 = this->_maxRows;
      fwrite(this->name,1,0x40,(FILE *)fp);
      fwrite(this->type,1,0x40,(FILE *)fp);
      fwrite(&typeSize,8,1,(FILE *)fp);
      fwrite(&local_b8,8,1,(FILE *)fp);
      fwrite(&_maxRows64,8,1,(FILE *)fp);
      uVar1 = this->_maxRows;
      new_elements_ = local_b8;
      if (uVar1 <= local_b8) {
        new_elements_ = uVar1;
      }
      uVar4 = (long)(this->data).
                    super__Vector_base<ns_MVECTOR::MVECTOR<unsigned_char>,_std::allocator<ns_MVECTOR::MVECTOR<unsigned_char>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->data).
                    super__Vector_base<ns_MVECTOR::MVECTOR<unsigned_char>,_std::allocator<ns_MVECTOR::MVECTOR<unsigned_char>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 6;
      if (new_elements_ < uVar4) {
        iVar3 = -9999;
        CECS::RecError((CECS *)CCEXPECS,-9999,1,"CCEXP.hpp",0x1af,
                       "CCEXPMat::StoreData():: Table [%s] containing more Rows (=%zu) than MaxRows (=%zu)"
                       ,this->name,uVar4,uVar1);
        fclose((FILE *)fp);
      }
      else {
        if (new_elements_ != 0) {
          ns_MVECTOR::MVECTOR<unsigned_long>::MVECTOR(&DPL);
          ns_MVECTOR::MVECTOR<unsigned_long>::resize(&DPL,new_elements_);
          pMVar2 = (this->data).
                   super__Vector_base<ns_MVECTOR::MVECTOR<unsigned_char>,_std::allocator<ns_MVECTOR::MVECTOR<unsigned_char>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          lVar6 = 0;
          for (pMVar5 = (this->data).
                        super__Vector_base<ns_MVECTOR::MVECTOR<unsigned_char>,_std::allocator<ns_MVECTOR::MVECTOR<unsigned_char>_>_>
                        ._M_impl.super__Vector_impl_data._M_start; pMVar5 != pMVar2;
              pMVar5 = pMVar5 + 1) {
            ns_MVECTOR::MVECTOR<unsigned_char>::MVECTOR(&n,pMVar5);
            *(size_t *)((long)DPL.pdata + lVar6) = n.elements;
            ns_MVECTOR::MVECTOR<unsigned_char>::~MVECTOR(&n);
            lVar6 = lVar6 + 8;
          }
          fwrite(DPL.pdata,8,new_elements_,(FILE *)fp);
          ns_MVECTOR::MVECTOR<unsigned_long>::clear(&DPL);
          __size = typeSize;
          pMVar2 = (this->data).
                   super__Vector_base<ns_MVECTOR::MVECTOR<unsigned_char>,_std::allocator<ns_MVECTOR::MVECTOR<unsigned_char>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          for (pMVar5 = (this->data).
                        super__Vector_base<ns_MVECTOR::MVECTOR<unsigned_char>,_std::allocator<ns_MVECTOR::MVECTOR<unsigned_char>_>_>
                        ._M_impl.super__Vector_impl_data._M_start; pMVar5 != pMVar2;
              pMVar5 = pMVar5 + 1) {
            ns_MVECTOR::MVECTOR<unsigned_char>::MVECTOR(&n,pMVar5);
            fwrite(n.pdata,__size,n.elements,(FILE *)fp);
            ns_MVECTOR::MVECTOR<unsigned_char>::~MVECTOR(&n);
          }
          ns_MVECTOR::MVECTOR<unsigned_long>::~MVECTOR(&DPL);
        }
        iVar3 = 0;
      }
    }
  }
  return iVar3;
}

Assistant:

int CCEXPMat<T>::StoreData(FILE* fp) {
	if (IgnoreM) return 0;
	CECS_ERRI(CCEXPECS,fp == NULL,"CCEXPMat::StoreData():: File pointer is NULL! (!%u!)");

	uint64_t N = (uint64_t)data.size();
	uint64_t typeSize = (uint64_t)sizeof(T);
	uint64_t _maxRows64 = (uint64_t)_maxRows;

	fwrite(name,sizeof(char),64,fp); /// Table, Name
	fwrite(type,sizeof(char),64,fp); /// Table, Type (string)
	fwrite(&typeSize,sizeof(uint64_t),1,fp); /// Table, type size in Bytes
	fwrite(&N,sizeof(uint64_t),1,fp); /// Table, number of rows
	fwrite(&_maxRows64,sizeof(uint64_t),1,fp); /// Maximum rows of the table.
	if (N > _maxRows) N = _maxRows; /// Limit Rows ...

	CECS_ERRO(CCEXPECS,data.size() > N, {fclose(fp); return _CECS_DEFAULT_ERRID;},
			"CCEXPMat::StoreData():: Table [%s] containing more Rows (=" __ZU__ ") than MaxRows (=" __ZU__ ")",
			name, data.size(), _maxRows)

	if (N > 0) {
		MVECTOR<uint64_t> DPL; DPL.resize(N);
		int i = 0;
		for (MVECTOR<T> n : data) DPL[i++] = (uint64_t)n.size();
		fwrite(DPL.data(), sizeof(uint64_t), N, fp);
		__CCEXP_VECTOR_CLEAR(DPL);
		for (MVECTOR<T> n : data) fwrite(n.data(), typeSize, n.size(), fp);
	}
	return 0;
}